

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O1

void GPU_MatrixFrustum(float *result,float left,float right,float bottom,float top,float z_near,
                      float z_far)

{
  float temp [16];
  float local_98 [6];
  undefined8 local_80;
  float local_78;
  float local_74;
  float local_70;
  undefined8 local_6c;
  undefined4 local_64;
  float local_60;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (result != (float *)0x0) {
    local_98[0] = (z_near + z_near) / (right - left);
    local_98[5] = (z_near + z_near) / (top - bottom);
    local_98[1] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[4] = 0.0;
    local_80 = 0;
    local_78 = (left + right) / (right - left);
    local_74 = (bottom + top) / (top - bottom);
    local_70 = -(z_near + z_far) / (z_far - z_near);
    local_6c = 0xbf800000;
    local_64 = 0;
    local_60 = (z_far * -2.0 * z_near) / (z_far - z_near);
    local_5c = 0;
    GPU_MatrixMultiply((float *)&local_58,result,local_98);
    *(undefined8 *)(result + 0xc) = local_28;
    *(undefined8 *)(result + 0xe) = uStack_20;
    *(undefined8 *)(result + 8) = local_38;
    *(undefined8 *)(result + 10) = uStack_30;
    *(undefined8 *)(result + 4) = local_48;
    *(undefined8 *)(result + 6) = uStack_40;
    *(undefined8 *)result = local_58;
    *(undefined8 *)(result + 2) = uStack_50;
  }
  return;
}

Assistant:

void GPU_MatrixFrustum(float* result, float left, float right, float bottom, float top, float z_near, float z_far)
{
    if(result == NULL)
		return;

	{
		float A[16];
		FILL_MATRIX_4x4(A, 
				2 * z_near / (right - left), 0, 0, 0,
				0, 2 * z_near / (top - bottom), 0, 0,
				(right + left) / (right - left), (top + bottom) / (top - bottom), -(z_far + z_near) / (z_far - z_near), -1,
				0, 0, -(2 * z_far * z_near) / (z_far - z_near), 0
			);

		GPU_MultiplyAndAssign(result, A);
	}
}